

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCore.c
# Opt level: O1

void Sbd_ManMergeTest(Sbd_Man_t *p)

{
  uint uVar1;
  Gia_Man_t *pGVar2;
  long lVar3;
  long lVar4;
  
  pGVar2 = p->pGia;
  if (0 < pGVar2->nObjs) {
    lVar4 = 0;
    lVar3 = 0;
    do {
      uVar1 = *(uint *)(&pGVar2->pObjs->field_0x0 + lVar4);
      if ((~uVar1 & 0x1fffffff) != 0 && -1 < (int)uVar1) {
        Sbd_ManMergeCuts(p,(int)lVar3);
      }
      lVar3 = lVar3 + 1;
      pGVar2 = p->pGia;
      lVar4 = lVar4 + 0xc;
    } while (lVar3 < pGVar2->nObjs);
  }
  uVar1 = Sbd_ManDelay(p);
  printf("Delay %d.\n",(ulong)uVar1);
  return;
}

Assistant:

void Sbd_ManMergeTest( Sbd_Man_t * p )
{
    int Node;
    Gia_ManForEachAndId( p->pGia, Node )
        Sbd_ManMergeCuts( p, Node );
    printf( "Delay %d.\n", Sbd_ManDelay(p) );
}